

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  vector<Point,_std::allocator<Point>_> original_points;
  vector<Point,_std::allocator<Point>_> processed_points;
  allocator<char> local_61;
  string local_60;
  _Vector_base<Point,_std::allocator<Point>_> local_40;
  _Vector_base<Point,_std::allocator<Point>_> local_28;
  
  std::ios::exceptions((int)*(undefined8 *)(std::cin + -0x18) + 0x106150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Enter 7 points. To terminate the input enter semicolon (;).",
             (allocator<char> *)&local_40);
  prompt_for_input(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Example: (2 5) (3 5);",(allocator<char> *)&local_40);
  prompt_for_input(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  get_points((vector<Point,_std::allocator<Point>_> *)&local_40,(istream *)&std::cin);
  print_points((vector<Point,_std::allocator<Point>_> *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"mydata.txt",(allocator<char> *)&local_28);
  write_points_to_file(&local_60,(vector<Point,_std::allocator<Point>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"mydata.txt",&local_61);
  read_points_from_file((vector<Point,_std::allocator<Point>_> *)&local_28,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  print_points((vector<Point,_std::allocator<Point>_> *)&local_28);
  bVar1 = are_set_equals((vector<Point,_std::allocator<Point>_> *)&local_40,
                         (vector<Point,_std::allocator<Point>_> *)&local_28);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"Something\'s wrong!\n");
  }
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_28);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_40);
  return 0;
}

Assistant:

int main()
{
	std::cin.exceptions(std::cin.exceptions() | std::ios_base::badbit);
	prompt_for_input("Enter 7 points. To terminate the input enter semicolon (;).");
	prompt_for_input("Example: (2 5) (3 5);");
	try
	{
		std::vector<Point> original_points = get_points(std::cin);
		print_points(original_points);
		write_points_to_file("mydata.txt", original_points);
		auto processed_points = read_points_from_file("mydata.txt");
		print_points(processed_points);
		if (!are_set_equals(original_points, processed_points))
		{
			std::cerr << "Something's wrong!\n";
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	
}